

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_options.h
# Opt level: O0

void __thiscall google::protobuf::compiler::cpp::Options::Options(Options *this)

{
  Options *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->safe_boundary_check = false;
  this->proto_h = false;
  this->transitive_pb_h = true;
  this->annotate_headers = false;
  this->enforce_lite = false;
  this->table_driven_parsing = false;
  std::__cxx11::string::string((string *)&this->annotation_pragma_name);
  std::__cxx11::string::string((string *)&this->annotation_guard_name);
  return;
}

Assistant:

Options()
      : safe_boundary_check(false),
        proto_h(false),
        transitive_pb_h(true),
        annotate_headers(false),
        enforce_lite(false),
        table_driven_parsing(false) {}